

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryLike.h
# Opt level: O3

void __thiscall GPIO::DictionaryLike::DictionaryLike(DictionaryLike *this,DictionaryLike *other)

{
  pointer pcVar1;
  bool bVar2;
  
  (this->data)._M_dataplus._M_p = (pointer)&(this->data).field_2;
  pcVar1 = (other->data)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + (other->data)._M_string_length);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&(this->dictionary)._M_t,&(other->dictionary)._M_t);
  bVar2 = other->is_dictionary;
  this->is_parsed = other->is_parsed;
  this->is_dictionary = bVar2;
  return;
}

Assistant:

DictionaryLike(const DictionaryLike& other) = default;